

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

void ImageClearBackground(Image *dst,Color color)

{
  void *__src;
  int iVar1;
  void *__dest;
  long lVar2;
  
  if ((((dst->data != (void *)0x0) && (dst->width != 0)) && (dst->height != 0)) &&
     (ImageDrawPixel(dst,0,0,color), 1 < dst->height * dst->width)) {
    __src = dst->data;
    iVar1 = GetPixelDataSize(1,1,dst->format);
    lVar2 = 1;
    __dest = __src;
    do {
      __dest = (void *)((long)__dest + (long)iVar1);
      memcpy(__dest,__src,(long)iVar1);
      lVar2 = lVar2 + 1;
    } while (lVar2 < (long)dst->height * (long)dst->width);
  }
  return;
}

Assistant:

void ImageClearBackground(Image *dst, Color color)
{
    // Security check to avoid program crash
    if ((dst->data == NULL) || (dst->width == 0) || (dst->height == 0)) return;

    // Fill in first pixel based on image format
    ImageDrawPixel(dst, 0, 0, color);

    unsigned char *pSrcPixel = (unsigned char *)dst->data;
    int bytesPerPixel = GetPixelDataSize(1, 1, dst->format);

    // Repeat the first pixel data throughout the image
    for (int i = 1; i < dst->width*dst->height; i++)
    {
        memcpy(pSrcPixel + i*bytesPerPixel, pSrcPixel, bytesPerPixel);
    }
}